

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

void Corrade::Containers::
     ArrayNewAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::deleter(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,size_t size)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = data;
  for (lVar1 = size << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    std::__cxx11::string::~string((string *)this);
    this = this + 1;
  }
  operator_delete__((void *)((long)&data[-1].field_2 + 8));
  return;
}

Assistant:

static void deleter(T* data, std::size_t size) {
        for(T *it = data, *end = data + size; it != end; ++it) it->~T();
        deallocate(data);
    }